

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionOK.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionOK::write_cpp
          (InstructionOK *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter)

{
  bool bVar1;
  StreamSep *pSVar2;
  StreamSep local_1e0;
  StreamSepMaker local_198;
  StreamSep local_110;
  StreamSep local_c8;
  StreamSep local_70;
  CppEmitter *local_28;
  CppEmitter *cpp_emitter_local;
  StreamSepMaker *es_local;
  StreamSepMaker *ss_local;
  InstructionOK *this_local;
  
  local_28 = cpp_emitter;
  cpp_emitter_local = (CppEmitter *)es;
  es_local = ss;
  ss_local = (StreamSepMaker *)this;
  bVar1 = CppEmitter::interruptible(cpp_emitter);
  if (bVar1) {
    StreamSepMaker::operator<<(&local_70,es_local,(char (*) [27])0x24a1e6);
    local_28->nb_cont_label = local_28->nb_cont_label + 1;
    pSVar2 = StreamSep::operator<<(&local_70,&local_28->nb_cont_label);
    StreamSep::operator<<(pSVar2,(char (*) [2])0x2496e8);
    StreamSep::~StreamSep(&local_70);
  }
  StreamSepMaker::operator<<(&local_c8,es_local,(char (*) [15])"return RET_OK;");
  StreamSep::~StreamSep(&local_c8);
  bVar1 = CppEmitter::interruptible(local_28);
  if (bVar1) {
    StreamSepMaker::rm_beg(&local_198,(StreamSepMaker *)cpp_emitter_local,2);
    StreamSepMaker::operator<<(&local_110,&local_198,(char (*) [3])0x24a333);
    pSVar2 = StreamSep::operator<<(&local_110,&local_28->nb_cont_label);
    StreamSep::operator<<(pSVar2,(char (*) [2])0x2497fc);
    StreamSep::~StreamSep(&local_110);
    StreamSepMaker::~StreamSepMaker(&local_198);
    StreamSepMaker::operator<<
              (&local_1e0,(StreamSepMaker *)cpp_emitter_local,(char (*) [21])"return RET_ENDED_OK;")
    ;
    StreamSep::~StreamSep(&local_1e0);
  }
  return;
}

Assistant:

void InstructionOK::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    if ( cpp_emitter->interruptible() )
        ss << "HPIPE_DATA.inp_cont = &&c_" << ++cpp_emitter->nb_cont_label << ";";

    ss << "return RET_OK;";

    if ( cpp_emitter->interruptible() ) {
        es.rm_beg( 2 ) << "c_" << cpp_emitter->nb_cont_label << ":";
        es << "return RET_ENDED_OK;";
    }
}